

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

llm_graph_input_attn_cross * __thiscall
llm_graph_context::build_attn_inp_cross(llm_graph_context *this)

{
  undefined8 uVar1;
  bool bVar2;
  ggml_tensor *pgVar3;
  pointer plVar4;
  pointer this_00;
  llm_graph_input_attn_cross *plVar5;
  long in_RDI;
  int32_t n_enc;
  __single_object inp;
  llm_graph_input_ptr *in_stack_ffffffffffffff68;
  unique_ptr<llm_graph_input_attn_cross,_std::default_delete<llm_graph_input_attn_cross>_> *__u;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff80;
  llama_cross **in_stack_ffffffffffffff88;
  ggml_tensor *local_68;
  int local_40;
  unique_ptr<llm_graph_input_attn_cross,_std::default_delete<llm_graph_input_attn_cross>_>
  local_10 [2];
  
  std::make_unique<llm_graph_input_attn_cross,llama_cross_const*const&>(in_stack_ffffffffffffff88);
  bVar2 = std::vector<float,_std::allocator<float>_>::empty(in_stack_ffffffffffffff80);
  if (bVar2) {
    local_40 = *(int *)(*(long *)(in_RDI + 8) + 4);
  }
  else {
    local_40 = (int)*(undefined8 *)(*(long *)(in_RDI + 0xf0) + 8);
  }
  pgVar3 = (ggml_tensor *)
           ggml_new_tensor_2d(*(undefined8 *)(in_RDI + 0xc0),0,(long)local_40,
                              (long)(int)(*(int *)(in_RDI + 0xa8) + 0x3fU & 0xffffffc0));
  plVar4 = std::
           unique_ptr<llm_graph_input_attn_cross,_std::default_delete<llm_graph_input_attn_cross>_>
           ::operator->((unique_ptr<llm_graph_input_attn_cross,_std::default_delete<llm_graph_input_attn_cross>_>
                         *)0x436de0);
  plVar4->cross_kq_mask = pgVar3;
  plVar4 = std::
           unique_ptr<llm_graph_input_attn_cross,_std::default_delete<llm_graph_input_attn_cross>_>
           ::operator->((unique_ptr<llm_graph_input_attn_cross,_std::default_delete<llm_graph_input_attn_cross>_>
                         *)0x436df3);
  ggml_set_input(plVar4->cross_kq_mask);
  if ((*(byte *)(*(long *)(in_RDI + 0x10) + 0x3b) & 1) == 0) {
    plVar4 = std::
             unique_ptr<llm_graph_input_attn_cross,_std::default_delete<llm_graph_input_attn_cross>_>
             ::operator->((unique_ptr<llm_graph_input_attn_cross,_std::default_delete<llm_graph_input_attn_cross>_>
                           *)0x436e5e);
    local_68 = plVar4->cross_kq_mask;
  }
  else {
    uVar1 = *(undefined8 *)(in_RDI + 0xc0);
    plVar4 = std::
             unique_ptr<llm_graph_input_attn_cross,_std::default_delete<llm_graph_input_attn_cross>_>
             ::operator->((unique_ptr<llm_graph_input_attn_cross,_std::default_delete<llm_graph_input_attn_cross>_>
                           *)0x436e2b);
    local_68 = (ggml_tensor *)ggml_cast(uVar1,plVar4->cross_kq_mask,1);
  }
  __u = local_10;
  plVar4 = std::
           unique_ptr<llm_graph_input_attn_cross,_std::default_delete<llm_graph_input_attn_cross>_>
           ::operator->((unique_ptr<llm_graph_input_attn_cross,_std::default_delete<llm_graph_input_attn_cross>_>
                         *)0x436e83);
  plVar4->cross_kq_mask_cnv = local_68;
  this_00 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x436e9d);
  std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>::
  unique_ptr<llm_graph_input_attn_cross,std::default_delete<llm_graph_input_attn_cross>,void>
            ((unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)this_00,__u);
  plVar5 = (llm_graph_input_attn_cross *)
           llm_graph_result::add_input((llm_graph_result *)local_68,in_stack_ffffffffffffff68);
  std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>::~unique_ptr
            ((unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)local_68);
  std::unique_ptr<llm_graph_input_attn_cross,_std::default_delete<llm_graph_input_attn_cross>_>::
  ~unique_ptr((unique_ptr<llm_graph_input_attn_cross,_std::default_delete<llm_graph_input_attn_cross>_>
               *)local_68);
  return plVar5;
}

Assistant:

llm_graph_input_attn_cross * llm_graph_context::build_attn_inp_cross() const {
    auto inp = std::make_unique<llm_graph_input_attn_cross>(cross);

    const int32_t n_enc = !cross->v_embd.empty() ? cross->n_enc : hparams.n_ctx_train;

    inp->cross_kq_mask = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_enc, GGML_PAD(n_tokens, GGML_KQ_MASK_PAD));
    ggml_set_input(inp->cross_kq_mask);

    inp->cross_kq_mask_cnv = cparams.flash_attn ? ggml_cast(ctx0, inp->cross_kq_mask, GGML_TYPE_F16) : inp->cross_kq_mask;

    return (llm_graph_input_attn_cross *) res->add_input(std::move(inp));
}